

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Sol * exampleB(Sol *__return_storage_ptr__,vector<ride,_std::allocator<ride>_> *rides,long vehs,
              long STEPS)

{
  pointer prVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long i;
  long lVar6;
  ulong __n;
  long lVar7;
  long lVar8;
  value_type *__x;
  reference rVar9;
  veh v;
  long local_98;
  size_type local_90;
  priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_> vehicles;
  vector<bool,_std::allocator<bool>_> used;
  
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&used,(long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 6,(bool *)&vehicles,
             (allocator_type *)&v);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::vector(__return_storage_ptr__,vehs,(allocator_type *)&vehicles);
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  lVar6 = 0;
  if (vehs < 1) {
    vehs = lVar6;
  }
  for (; vehs != lVar6; lVar6 = lVar6 + 1) {
    v.avail_time = 0;
    v.loc.x = 0;
    v.loc.y = 0;
    v.id = lVar6;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
              (&vehicles,&v);
  }
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 6); uVar3 = uVar3 + 1) {
    v.id = (vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.super__Vector_impl_data
           ._M_start)->id;
    v.avail_time = (vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                    super__Vector_impl_data._M_start)->avail_time;
    v.loc.x = ((vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                super__Vector_impl_data._M_start)->loc).x;
    v.loc.y = ((vehicles.c.super__Vector_base<veh,_std::allocator<veh>_>._M_impl.
                super__Vector_impl_data._M_start)->loc).y;
    std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::pop
              (&vehicles);
    if (STEPS <= v.avail_time) break;
    lVar6 = 0x28;
    lVar5 = 0x7fffffffffffffff;
    local_90 = 0xffffffffffffffff;
    local_98 = 0;
    for (__n = 0; prVar1 = (rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                           super__Vector_impl_data._M_start,
        __n < (ulong)((long)(rides->super__Vector_base<ride,_std::allocator<ride>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)prVar1 >> 6); __n = __n + 1) {
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n);
      if ((*rVar9._M_p & rVar9._M_mask) == 0) {
        lVar2 = *(long *)((long)prVar1 + lVar6 + -0x18);
        if (v.avail_time <= lVar2) {
          lVar4 = v.loc.x - *(long *)((long)prVar1 + lVar6 + -8);
          lVar8 = -lVar4;
          if (0 < lVar4) {
            lVar8 = lVar4;
          }
          lVar7 = v.loc.y - *(long *)((long)&prVar1->id + lVar6);
          lVar4 = -lVar7;
          if (0 < lVar7) {
            lVar4 = lVar7;
          }
          lVar4 = lVar4 + lVar8;
          lVar8 = *(long *)((long)prVar1 + lVar6 + -0x10);
          lVar7 = v.avail_time + lVar8 + lVar4;
          lVar8 = lVar8 + *(long *)((long)prVar1 + lVar6 + -0x20);
          if (lVar8 < lVar7) {
            lVar8 = lVar7;
          }
          if (lVar8 <= lVar2 && lVar4 < lVar5) {
            lVar5 = lVar4;
            local_98 = lVar8;
            local_90 = __n;
          }
        }
      }
      lVar6 = lVar6 + 0x40;
    }
    if (-1 < (long)local_90) {
      __x = prVar1 + local_90;
      std::vector<ride,_std::allocator<ride>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + v.id,__x);
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,local_90);
      *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
      v.avail_time = local_98;
      if (__x->e_time < local_98) {
        __assert_fail("min_end <= chosen.e_time",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oskopek[P]ghc18/main.cpp"
                      ,0x89,"Sol exampleB(const vector<ride> &, const long, const long)");
      }
      v.loc.x = (__x->end).x;
      v.loc.y = (__x->end).y;
      std::priority_queue<veh,_std::vector<veh,_std::allocator<veh>_>,_std::less<veh>_>::push
                (&vehicles,&v);
    }
  }
  std::_Vector_base<veh,_std::allocator<veh>_>::~_Vector_base
            ((_Vector_base<veh,_std::allocator<veh>_> *)&vehicles);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&used.super__Bvector_base<std::allocator<bool>_>);
  return __return_storage_ptr__;
}

Assistant:

Sol exampleB(const vector<ride>& rides, const long vehs, const long STEPS) {
    vector<bool> used(rides.size(), false);
    Sol sol(vehs);
    priority_queue<veh> vehicles;
    for (long i = 0; i < vehs; i++) {
        vehicles.push(veh{i, 0, pt{0, 0}});
    }

    for (long used_rides = 0; used_rides < rides.size(); used_rides++) {
        veh v = vehicles.top(); vehicles.pop();
        if (v.avail_time >= STEPS) break;

        // Find closest ride
        long min_closeness = LONG_MAX;
        long min_idx = -1;
        long min_end = 0;
        for (long i = 0; i < rides.size(); i++) {
            const ride& r = rides[i];
            if (used[i]) continue;
            if (r.e_time < v.avail_time) continue;
            const long closeness = dist(v.loc, r.start);
            const long end_time = max(v.avail_time + closeness + r.len, r.s_time + r.len); // max(no-wait, wait)
            if (closeness < min_closeness && end_time <= r.e_time) {
                min_closeness = closeness;
                min_idx = i;
                min_end = end_time;
            }
        }

        if (min_idx < 0) {
            continue; // leave out this car, cannot use it again
        }
        // Update sol
        const ride& chosen = rides[min_idx];
        sol[v.id].push_back(chosen);
        used[min_idx] = true;

        // Update vehicle
        v.avail_time = min_end;
        assert(min_end <= chosen.e_time);
        v.loc = chosen.end;
        vehicles.push(v);
    }

    return sol;
}